

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

void __thiscall
cmInstalledFile::GetPropertyAsList
          (cmInstalledFile *this,string *prop,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list)

{
  string value;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  GetProperty(this,prop,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(list,(list->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::ExpandListArgument(&local_30,list,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmInstalledFile::GetPropertyAsList(const std::string& prop,
                                        std::vector<std::string>& list) const
{
  std::string value;
  this->GetProperty(prop, value);

  list.clear();
  cmSystemTools::ExpandListArgument(value, list);
}